

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O1

token * skiwi::anon_unknown_2::take
                  (token *__return_storage_ptr__,
                  vector<skiwi::token,_std::allocator<skiwi::token>_> *tokens)

{
  pointer ptVar1;
  pointer pcVar2;
  int iVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  
  if ((tokens->super__Vector_base<skiwi::token,_std::allocator<skiwi::token>_>)._M_impl.
      super__Vector_impl_data._M_start ==
      (tokens->super__Vector_base<skiwi::token,_std::allocator<skiwi::token>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    throw_parse_error(no_tokens);
  }
  ptVar1 = (tokens->super__Vector_base<skiwi::token,_std::allocator<skiwi::token>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  __return_storage_ptr__->type = ptVar1[-1].type;
  (__return_storage_ptr__->value)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->value).field_2;
  pcVar2 = ptVar1[-1].value._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->value,pcVar2,
             pcVar2 + ptVar1[-1].value._M_string_length);
  iVar3 = ptVar1[-1].column_nr;
  __return_storage_ptr__->line_nr = ptVar1[-1].line_nr;
  __return_storage_ptr__->column_nr = iVar3;
  (anonymous_namespace)::popped_token = __return_storage_ptr__->type;
  std::__cxx11::string::_M_assign((string *)&DAT_002a97d0);
  _DAT_002a97f0 = __return_storage_ptr__->line_nr;
  unique0x00012004 = __return_storage_ptr__->column_nr;
  ptVar1 = (tokens->super__Vector_base<skiwi::token,_std::allocator<skiwi::token>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  (tokens->super__Vector_base<skiwi::token,_std::allocator<skiwi::token>_>)._M_impl.
  super__Vector_impl_data._M_finish = ptVar1 + -1;
  pcVar2 = ptVar1[-1].value._M_dataplus._M_p;
  paVar4 = &ptVar1[-1].value.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar4) {
    operator_delete(pcVar2,paVar4->_M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

token take(std::vector<token>& tokens)
    {
    if (tokens.empty())
      {
      throw_parse_error(no_tokens);
      }
    token t = tokens.back();
    popped_token = t;
    tokens.pop_back();
    return t;
    }